

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O1

void iutest::TestEnv::ReleaseGlobalTestEnvironment(void)

{
  pointer __src;
  pointer *pppEVar1;
  pointer __dest;
  Environment *pEVar2;
  pointer ppEVar3;
  Variable *pVVar4;
  
  pVVar4 = get_vars();
  __dest = (pVVar4->m_environment_list).
           super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar4 = get_vars();
  if (__dest != (pVVar4->m_environment_list).
                super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    __src = __dest + 1;
    do {
      pEVar2 = *__dest;
      pVVar4 = get_vars();
      ppEVar3 = (pVVar4->m_environment_list).
                super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (__src != ppEVar3) {
        memmove(__dest,__src,(long)ppEVar3 - (long)__src);
      }
      pppEVar1 = &(pVVar4->m_environment_list).
                  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + -1;
      if (pEVar2 != (Environment *)0x0) {
        (**(code **)(*(long *)pEVar2 + 8))(pEVar2);
      }
      pVVar4 = get_vars();
    } while (__dest != (pVVar4->m_environment_list).
                       super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

static iuEnvironmentList& environments() { return get_vars().m_environment_list; }